

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O1

string * __thiscall
kratos::InterfaceDefinition::var
          (string *__return_storage_ptr__,InterfaceDefinition *this,string *name,uint32_t width,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *size)

{
  pointer pcVar1;
  iterator iVar2;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  string_view format_str;
  format_args args;
  string local_78;
  pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  local_38 = size;
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>
                  *)&this->vars_,name);
  if (iVar2._M_node == (_Base_ptr)&this->field_0x70) {
    local_58.first = width;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_58.second,local_38);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::pair<unsigned_int,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                *)&this->vars_,name,&local_58);
    if (local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.second.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_58.second.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_58.second.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + name->_M_string_length);
    return __return_storage_ptr__;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_58._0_8_ = (name->_M_dataplus)._M_p;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)name->_M_string_length;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)(this->name_)._M_dataplus._M_p;
  local_58.second.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)(this->name_)._M_string_length;
  format_str.size_ = 0xdd;
  format_str.data_ = (char *)0x19;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_58;
  fmt::v7::detail::vformat_abi_cxx11_(&local_78,(detail *)0x23caae,format_str,args);
  UserException::UserException(this_00,&local_78);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::string InterfaceDefinition::var(const std::string& name, uint32_t width,
                                     const std::vector<uint32_t>& size) {
    if (vars_.find(name) != vars_.end())
        throw UserException(::format("{0} already exists in {1}", name, name_));
    vars_.emplace(name, std::make_pair(width, size));
    return name;
}